

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sharpness_test.cc
# Opt level: O3

void __thiscall anon_unknown.dwarf_1ab7c07::SharpnessTest::DoTest(SharpnessTest *this)

{
  undefined8 *puVar1;
  bool bVar2;
  Y4mVideoSource *this_00;
  const_iterator cVar3;
  const_iterator cVar4;
  const_iterator cVar5;
  undefined8 uVar6;
  AssertHelper AVar7;
  SEARCH_METHODS *pSVar8;
  double psnr;
  HasNewFatalFailureHelper gtest_fatal_failure_checker;
  AssertHelper local_60;
  AssertHelper local_58;
  undefined1 local_50 [16];
  long local_40 [2];
  AssertHelper local_30;
  _Head_base<0UL,_libaom_test::VideoSource_*,_false> local_28;
  
  (this->super_EncoderTest).init_flags_ = 0x10000;
  this_00 = (Y4mVideoSource *)operator_new(0xd8);
  local_50._0_8_ = local_40;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"paris_352_288_30.y4m","");
  libaom_test::Y4mVideoSource::Y4mVideoSource(this_00,(string *)local_50,0,10);
  local_28._M_head_impl = (VideoSource *)this_00;
  if ((long *)local_50._0_8_ != local_40) {
    operator_delete((void *)local_50._0_8_);
  }
  local_58.data_ = (AssertHelperData *)0x0;
  testing::internal::
  CmpHelperNE<std::unique_ptr<libaom_test::VideoSource,std::default_delete<libaom_test::VideoSource>>,decltype(nullptr)>
            ((internal *)local_50,"video","nullptr",
             (unique_ptr<libaom_test::VideoSource,_std::default_delete<libaom_test::VideoSource>_> *
             )&local_28,&local_58.data_);
  if (local_50[0] == (string)0x0) {
    testing::Message::Message((Message *)&local_58);
    if ((undefined8 *)CONCAT71(local_50._9_7_,local_50[8]) == (undefined8 *)0x0) {
      pSVar8 = "";
    }
    else {
      pSVar8 = *(SEARCH_METHODS **)CONCAT71(local_50._9_7_,local_50[8]);
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_60,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/sharpness_test.cc"
               ,100,(char *)pSVar8);
    testing::internal::AssertHelper::operator=(&local_60,(Message *)&local_58);
    testing::internal::AssertHelper::~AssertHelper(&local_60);
    AVar7.data_ = local_58.data_;
LAB_0067bfc8:
    if (AVar7.data_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)AVar7.data_ + 8))();
    }
LAB_0067bfd3:
    puVar1 = (undefined8 *)CONCAT71(local_50._9_7_,local_50[8]);
    if (puVar1 != (undefined8 *)0x0) {
      if ((undefined8 *)*puVar1 != puVar1 + 2) {
        operator_delete((undefined8 *)*puVar1);
      }
      operator_delete(puVar1);
    }
  }
  else {
    puVar1 = (undefined8 *)CONCAT71(local_50._9_7_,local_50[8]);
    if (puVar1 != (undefined8 *)0x0) {
      if ((undefined8 *)*puVar1 != puVar1 + 2) {
        operator_delete((undefined8 *)*puVar1);
      }
      operator_delete(puVar1);
    }
    bVar2 = testing::internal::AlwaysTrue();
    if (bVar2) {
      testing::internal::HasNewFatalFailureHelper::HasNewFatalFailureHelper
                ((HasNewFatalFailureHelper *)local_50);
      bVar2 = testing::internal::AlwaysTrue();
      if (bVar2) {
        (*(this->super_EncoderTest)._vptr_EncoderTest[2])
                  (&this->super_EncoderTest,local_28._M_head_impl);
      }
      bVar2 = local_50[8];
      testing::internal::HasNewFatalFailureHelper::~HasNewFatalFailureHelper
                ((HasNewFatalFailureHelper *)local_50);
      if (bVar2 == false) {
        local_58.data_ = (AssertHelperData *)0x0;
        if (this->nframes_ != 0) {
          local_58.data_ = (AssertHelperData *)(this->psnr_ / (double)this->nframes_);
        }
        local_30.data_._0_4_ = *(undefined4 *)&(this->super_EncoderTest).field_0x3dc;
        cVar3 = std::
                _Hashtable<int,_std::pair<const_int,_std::unordered_map<int,_std::unordered_map<int,_double,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_double>_>_>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::unordered_map<int,_double,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_double>_>_>_>_>_>_>,_std::allocator<std::pair<const_int,_std::unordered_map<int,_std::unordered_map<int,_double,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_double>_>_>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::unordered_map<int,_double,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_double>_>_>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                ::find((_Hashtable<int,_std::pair<const_int,_std::unordered_map<int,_std::unordered_map<int,_double,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_double>_>_>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::unordered_map<int,_double,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_double>_>_>_>_>_>_>,_std::allocator<std::pair<const_int,_std::unordered_map<int,_std::unordered_map<int,_double,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_double>_>_>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::unordered_map<int,_double,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_double>_>_>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                        *)(anonymous_namespace)::kPsnrThreshold,(key_type *)&local_30);
        if (cVar3.
            super__Node_iterator_base<std::pair<const_int,_std::unordered_map<int,_std::unordered_map<int,_double,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_double>_>_>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::unordered_map<int,_double,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_double>_>_>_>_>_>_>,_false>
            ._M_cur == (__node_type *)0x0) {
LAB_0067c1af:
          uVar6 = std::__throw_out_of_range("_Map_base::at");
          testing::internal::AssertHelper::~AssertHelper(&local_30);
          if (local_60.data_ != (AssertHelperData *)0x0) {
            (**(code **)(*(long *)local_60.data_ + 8))();
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_50);
          if ((Y4mVideoSource *)local_28._M_head_impl != (Y4mVideoSource *)0x0) {
            (*((VideoSource *)&(local_28._M_head_impl)->_vptr_VideoSource)->_vptr_VideoSource[1])();
          }
          _Unwind_Resume(uVar6);
        }
        cVar4 = std::
                _Hashtable<int,_std::pair<const_int,_std::unordered_map<int,_double,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_double>_>_>_>,_std::allocator<std::pair<const_int,_std::unordered_map<int,_double,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_double>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                ::find((_Hashtable<int,_std::pair<const_int,_std::unordered_map<int,_double,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_double>_>_>_>,_std::allocator<std::pair<const_int,_std::unordered_map<int,_double,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_double>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                        *)((long)cVar3.
                                 super__Node_iterator_base<std::pair<const_int,_std::unordered_map<int,_std::unordered_map<int,_double,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_double>_>_>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::unordered_map<int,_double,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_double>_>_>_>_>_>_>,_false>
                                 ._M_cur + 0x10),&this->cpu_used_);
        if (cVar4.
            super__Node_iterator_base<std::pair<const_int,_std::unordered_map<int,_double,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_double>_>_>_>,_false>
            ._M_cur == (__node_type *)0x0) goto LAB_0067c1af;
        cVar5 = std::
                _Hashtable<int,_std::pair<const_int,_double>,_std::allocator<std::pair<const_int,_double>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                ::find((_Hashtable<int,_std::pair<const_int,_double>,_std::allocator<std::pair<const_int,_double>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                        *)((long)cVar4.
                                 super__Node_iterator_base<std::pair<const_int,_std::unordered_map<int,_double,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_double>_>_>_>,_false>
                                 ._M_cur + 0x10),&this->sharpness_level_);
        if (cVar5.super__Node_iterator_base<std::pair<const_int,_double>,_false>._M_cur ==
            (__node_type *)0x0) goto LAB_0067c1af;
        local_60.data_ =
             *(AssertHelperData **)
              ((long)cVar5.super__Node_iterator_base<std::pair<const_int,_double>,_false>._M_cur +
              0x10);
        testing::internal::CmpHelperGT<double,double>
                  ((internal *)local_50,"psnr","GetPsnrThreshold()",(double *)&local_58,
                   (double *)&local_60);
        if (local_50[0] == (string)0x0) {
          testing::Message::Message((Message *)&local_60);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&(local_60.data_)->line,"encoding mode = ",0x10);
          std::ostream::operator<<
                    (&(local_60.data_)->line,*(int *)&(this->super_EncoderTest).field_0x3dc);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&(local_60.data_)->line,", cpu used = ",0xd);
          std::ostream::operator<<(&(local_60.data_)->line,this->cpu_used_);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&(local_60.data_)->line,", sharpness level = ",0x14);
          std::ostream::operator<<(&(local_60.data_)->line,this->sharpness_level_);
          if ((undefined8 *)CONCAT71(local_50._9_7_,local_50[8]) == (undefined8 *)0x0) {
            pSVar8 = "";
          }
          else {
            pSVar8 = *(SEARCH_METHODS **)CONCAT71(local_50._9_7_,local_50[8]);
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_30,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/sharpness_test.cc"
                     ,0x68,(char *)pSVar8);
          testing::internal::AssertHelper::operator=(&local_30,(Message *)&local_60);
          testing::internal::AssertHelper::~AssertHelper(&local_30);
          AVar7.data_ = local_60.data_;
          goto LAB_0067bfc8;
        }
        goto LAB_0067bfd3;
      }
    }
    testing::Message::Message((Message *)local_50);
    testing::internal::AssertHelper::AssertHelper
              (&local_58,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/sharpness_test.cc"
               ,0x66,
               "Expected: RunLoop(video.get()) doesn\'t generate new fatal failures in the current thread.\n  Actual: it does."
              );
    testing::internal::AssertHelper::operator=(&local_58,(Message *)local_50);
    testing::internal::AssertHelper::~AssertHelper(&local_58);
    if ((long *)local_50._0_8_ != (long *)0x0) {
      (**(code **)(*(long *)local_50._0_8_ + 8))();
    }
  }
  if ((Y4mVideoSource *)local_28._M_head_impl != (Y4mVideoSource *)0x0) {
    (*((VideoSource *)&(local_28._M_head_impl)->_vptr_VideoSource)->_vptr_VideoSource[1])();
  }
  return;
}

Assistant:

void DoTest() {
    init_flags_ = AOM_CODEC_USE_PSNR;

    std::unique_ptr<libaom_test::VideoSource> video(
        new libaom_test::Y4mVideoSource("paris_352_288_30.y4m", 0, kFrames));
    ASSERT_NE(video, nullptr);

    ASSERT_NO_FATAL_FAILURE(RunLoop(video.get()));
    const double psnr = GetAveragePsnr();
    EXPECT_GT(psnr, GetPsnrThreshold())
        << "encoding mode = " << encoding_mode_ << ", cpu used = " << cpu_used_
        << ", sharpness level = " << sharpness_level_;
  }